

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistent_cohomology.h
# Opt level: O0

void __thiscall
Gudhi::persistent_cohomology::
Persistent_cohomology<Gudhi::cubical_complex::Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>,_Gudhi::persistent_cohomology::Field_Zp>
::Persistent_cohomology
          (Persistent_cohomology<Gudhi::cubical_complex::Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>,_Gudhi::persistent_cohomology::Field_Zp>
           *this,Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>
                 *cpx,bool persistence_dim_max)

{
  size_type sVar1;
  ulong uVar2;
  size_t sVar3;
  int *r;
  unsigned_long *p;
  unsigned_long uVar4;
  out_of_range *this_00;
  allocator<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_long,_int>_*>
  local_39;
  value_type local_38;
  allocator<unsigned_long> local_2d [19];
  allocator<int> local_1a;
  byte local_19;
  Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_> *pBStack_18;
  bool persistence_dim_max_local;
  Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_> *cpx_local;
  Persistent_cohomology<Gudhi::cubical_complex::Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>,_Gudhi::persistent_cohomology::Field_Zp>
  *this_local;
  
  this->cpx_ = cpx;
  local_19 = persistence_dim_max;
  pBStack_18 = cpx;
  cpx_local = (Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>
               *)this;
  sVar3 = cubical_complex::
          Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>::
          dimension(cpx);
  this->dim_max_ = (int)sVar3;
  Field_Zp::Field_Zp(&this->coeff_field_);
  sVar3 = cubical_complex::
          Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>::
          num_simplices(this->cpx_);
  this->num_simplices_ = sVar3;
  sVar1 = this->num_simplices_;
  std::allocator<int>::allocator(&local_1a);
  std::vector<int,_std::allocator<int>_>::vector(&this->ds_rank_,sVar1,&local_1a);
  std::allocator<int>::~allocator(&local_1a);
  sVar1 = this->num_simplices_;
  std::allocator<unsigned_long>::allocator(local_2d);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->ds_parent_,sVar1,local_2d);
  std::allocator<unsigned_long>::~allocator(local_2d);
  sVar1 = this->num_simplices_;
  local_38 = (value_type)0x0;
  std::allocator<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_long,_int>_*>::
  allocator(&local_39);
  std::
  vector<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_long,_int>_*,_std::allocator<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_long,_int>_*>_>
  ::vector(&this->ds_repr_,sVar1,&local_38,&local_39);
  std::allocator<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_long,_int>_*>::
  ~allocator(&local_39);
  r = std::vector<int,_std::allocator<int>_>::data(&this->ds_rank_);
  p = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data(&this->ds_parent_);
  boost::disjoint_sets<int_*,_unsigned_long_*,_boost::find_with_full_path_compression>::
  disjoint_sets(&this->dsets_,r,p);
  boost::intrusive::
  set<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_long,_int>,_boost::intrusive::constant_time_size<false>_>
  ::set(&this->cam_);
  *(undefined8 *)&(this->zero_cocycles_)._M_h._M_rehash_policy = 0;
  (this->zero_cocycles_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->zero_cocycles_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->zero_cocycles_)._M_h._M_element_count = 0;
  (this->zero_cocycles_)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->zero_cocycles_)._M_h._M_bucket_count = 0;
  (this->zero_cocycles_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::unordered_map(&this->zero_cocycles_);
  (this->transverse_idx_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (this->transverse_idx_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->transverse_idx_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->transverse_idx_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  *(undefined8 *)&(this->transverse_idx_)._M_t._M_impl = 0;
  *(undefined8 *)&(this->transverse_idx_)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  std::
  map<unsigned_long,_Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::cubical_complex::Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>,_Gudhi::persistent_cohomology::Field_Zp>::cocycle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::cubical_complex::Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>,_Gudhi::persistent_cohomology::Field_Zp>::cocycle>_>_>
  ::map(&this->transverse_idx_);
  (this->persistent_pairs_).
  super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->persistent_pairs_).
  super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->persistent_pairs_).
  super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::tuple<unsigned_long,_unsigned_long,_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_int>_>_>
  ::vector(&this->persistent_pairs_);
  length_interval::length_interval(&this->interval_length_policy,pBStack_18,0.0);
  Simple_object_pool<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_long,_int>_>
  ::Simple_object_pool<>(&this->column_pool_);
  Simple_object_pool<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_long,_int>_>
  ::Simple_object_pool<>(&this->cell_pool_);
  uVar2 = this->num_simplices_;
  uVar4 = std::numeric_limits<unsigned_long>::max();
  if (uVar4 < uVar2) {
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range
              (this_00,"The number of simplices is more than Simplex_key type numeric limit.");
    __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  if ((local_19 & 1) != 0) {
    this->dim_max_ = this->dim_max_ + 1;
  }
  return;
}

Assistant:

explicit Persistent_cohomology(FilteredComplex& cpx, bool persistence_dim_max = false)
      : cpx_(&cpx),
        dim_max_(cpx.dimension()),                       // upper bound on the dimension of the simplices
        coeff_field_(),                                  // initialize the field coefficient structure.
        num_simplices_(cpx_->num_simplices()),           // num_simplices save to avoid to call thrice the function
        ds_rank_(num_simplices_),                        // union-find
        ds_parent_(num_simplices_),                      // union-find
        ds_repr_(num_simplices_, NULL),                  // union-find -> annotation vectors
        dsets_(ds_rank_.data(), ds_parent_.data()),      // union-find
        cam_(),                                          // collection of annotation vectors
        zero_cocycles_(),                                // union-find -> Simplex_key of creator for 0-homology
        transverse_idx_(),                               // key -> row
        persistent_pairs_(),
        interval_length_policy(&cpx, 0),
        column_pool_(),  // memory pools for the CAM
        cell_pool_() {
    if (num_simplices_ > std::numeric_limits<Simplex_key>::max()) {
      // num_simplices must be strictly lower than the limit, because a value is reserved for null_key.
      throw std::out_of_range("The number of simplices is more than Simplex_key type numeric limit.");
    }
    if (persistence_dim_max) {
      ++dim_max_;
    }
  }